

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5ExprPhrase *
sqlite3Fts5ParseTerm(Fts5Parse *pParse,Fts5ExprPhrase *pAppend,Fts5Token *pToken,int bPrefix)

{
  Fts5Config *pFVar1;
  int iVar2;
  uint uVar3;
  char *z;
  size_t sVar4;
  Fts5ExprPhrase **ppFVar5;
  Fts5ExprPhrase *local_48;
  undefined8 local_40;
  int local_34;
  
  pFVar1 = pParse->pConfig;
  local_40 = 0;
  local_34 = 0;
  local_48 = pAppend;
  z = sqlite3Fts5Strndup(&local_34,pToken->p,pToken->n);
  iVar2 = local_34;
  if (local_34 == 0) {
    sqlite3Fts5Dequote(z);
    if (z == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      sVar4 = strlen(z);
      iVar2 = (*pFVar1->pTokApi->xTokenize)
                        (pFVar1->pTok,&local_48,SUB14(bPrefix != 0,0) * 2 + 1,z,(int)sVar4,
                         fts5ParseTokenize);
    }
  }
  sqlite3_free(z);
  if ((iVar2 == 0) && (iVar2 = (int)local_40, (int)local_40 == 0)) {
    if (pAppend == (Fts5ExprPhrase *)0x0) {
      uVar3 = pParse->nPhrase;
      if ((uVar3 & 7) == 0) {
        ppFVar5 = (Fts5ExprPhrase **)sqlite3_realloc64(pParse->apPhrase,(long)(int)uVar3 * 8 + 0x40)
        ;
        if (ppFVar5 == (Fts5ExprPhrase **)0x0) {
          pParse->rc = 7;
          goto LAB_001a7213;
        }
        pParse->apPhrase = ppFVar5;
        uVar3 = pParse->nPhrase;
      }
      pParse->nPhrase = uVar3 + 1;
    }
    if (local_48 == (Fts5ExprPhrase *)0x0) {
      local_48 = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&pParse->rc,0x40);
    }
    else if ((long)local_48->nTerm != 0) {
      local_48->aTerm[(long)local_48->nTerm + -1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[(long)pParse->nPhrase + -1] = local_48;
  }
  else {
    pParse->rc = iVar2;
LAB_001a7213:
    fts5ExprPhraseFree(local_48);
    local_48 = (Fts5ExprPhrase *)0x0;
  }
  return local_48;
}

Assistant:

static Fts5ExprPhrase *sqlite3Fts5ParseTerm(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprPhrase *pAppend,        /* Phrase to append to */
  Fts5Token *pToken,              /* String to tokenize */
  int bPrefix                     /* True if there is a trailing "*" */
){
  Fts5Config *pConfig = pParse->pConfig;
  TokenCtx sCtx;                  /* Context object passed to callback */
  int rc;                         /* Tokenize return code */
  char *z = 0;

  memset(&sCtx, 0, sizeof(TokenCtx));
  sCtx.pPhrase = pAppend;

  rc = fts5ParseStringFromToken(pToken, &z);
  if( rc==SQLITE_OK ){
    int flags = FTS5_TOKENIZE_QUERY | (bPrefix ? FTS5_TOKENIZE_PREFIX : 0);
    int n;
    sqlite3Fts5Dequote(z);
    n = (int)strlen(z);
    rc = sqlite3Fts5Tokenize(pConfig, flags, z, n, &sCtx, fts5ParseTokenize);
  }
  sqlite3_free(z);
  if( rc || (rc = sCtx.rc) ){
    pParse->rc = rc;
    fts5ExprPhraseFree(sCtx.pPhrase);
    sCtx.pPhrase = 0;
  }else{

    if( pAppend==0 ){
      if( (pParse->nPhrase % 8)==0 ){
        sqlite3_int64 nByte = sizeof(Fts5ExprPhrase*) * (pParse->nPhrase + 8);
        Fts5ExprPhrase **apNew;
        apNew = (Fts5ExprPhrase**)sqlite3_realloc64(pParse->apPhrase, nByte);
        if( apNew==0 ){
          pParse->rc = SQLITE_NOMEM;
          fts5ExprPhraseFree(sCtx.pPhrase);
          return 0;
        }
        pParse->apPhrase = apNew;
      }
      pParse->nPhrase++;
    }

    if( sCtx.pPhrase==0 ){
      /* This happens when parsing a token or quoted phrase that contains
      ** no token characters at all. (e.g ... MATCH '""'). */
      sCtx.pPhrase = sqlite3Fts5MallocZero(&pParse->rc, sizeof(Fts5ExprPhrase));
    }else if( sCtx.pPhrase->nTerm ){
      sCtx.pPhrase->aTerm[sCtx.pPhrase->nTerm-1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[pParse->nPhrase-1] = sCtx.pPhrase;
  }

  return sCtx.pPhrase;
}